

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS VerifyJsonParsesAsDictionaryOfNumbers(_Bool IsJson5,char *Json,size_t NumItems)

{
  JL_STATUS JVar1;
  JL_DATA_TYPE JVar2;
  bool Condition;
  char local_68 [4];
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  char itemName [16];
  JlDataObject *local_50;
  uint64_t u64;
  JlDataObject *object;
  size_t num;
  _Bool _result_1;
  _Bool _result;
  size_t sStack_30;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *dictionaryObject;
  size_t NumItems_local;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  sStack_30 = 100;
  num._4_4_ = WJTL_STATUS_SUCCESS;
  dictionaryObject = (JlDataObject *)NumItems;
  NumItems_local = (size_t)Json;
  Json_local._3_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,&stack0xffffffffffffffd0);
  num._3_1_ = JVar1 == JL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)num._3_1_,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsDictionaryOfNumbers",0x379);
  if ((num._3_1_ & 1) == 0) {
    num._4_4_ = WJTL_STATUS_FAILED;
  }
  if (errorAtPos == 0) {
    Json_local._4_4_ = num._4_4_;
  }
  else {
    JVar2 = JlGetObjectType((JlDataObject *)errorAtPos);
    num._2_1_ = JVar2 == JL_DATA_TYPE_DICTIONARY;
    WjTestLib_Assert((_Bool)num._2_1_,
                     "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfNumbers",0x37c);
    if ((num._2_1_ & 1) == 0) {
      num._4_4_ = WJTL_STATUS_FAILED;
    }
    for (object = (JlDataObject *)0x1; object <= dictionaryObject;
        object = (JlDataObject *)((long)&object->Type + 1)) {
      u64 = 0;
      local_50 = (JlDataObject *)0x0;
      memset(local_68,0,0x10);
      sprintf(local_68,"item%u",(ulong)object & 0xffffffff);
      JVar1 = JlGetObjectFromDictionaryByKey
                        ((JlDataObject *)errorAtPos,local_68,(JlDataObject **)&u64);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsDictionaryOfNumbers",0x385);
      if (JVar1 != JL_STATUS_SUCCESS) {
        num._4_4_ = WJTL_STATUS_FAILED;
      }
      JVar1 = JlGetObjectNumberU64((JlDataObject *)u64,(uint64_t *)&local_50);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsDictionaryOfNumbers",0x386);
      if (JVar1 != JL_STATUS_SUCCESS) {
        num._4_4_ = WJTL_STATUS_FAILED;
      }
      Condition = local_50 == object;
      WjTestLib_Assert(Condition,"u64 == num",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsDictionaryOfNumbers",0x387);
      if (!Condition) {
        num._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &dictionaryObject ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfNumbers",0x38b);
    if (JVar1 != JL_STATUS_SUCCESS) {
      num._4_4_ = WJTL_STATUS_FAILED;
    }
    Json_local._4_4_ = num._4_4_;
  }
  return Json_local._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsDictionaryOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        size_t          NumItems
    )
{
    JlDataObject*   dictionaryObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ) );
    if( NULL == dictionaryObject ) { return TestReturn; }

    JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );

    for( size_t num=1; num<=NumItems; num++ )
    {
        JlDataObject* object = NULL;
        uint64_t u64 = 0;
        char itemName [16] = {0};
        sprintf( itemName, "item%u", (uint32_t)num );

        JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ) );
        JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
        JL_ASSERT( u64 == num );
    }

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &dictionaryObject ) );

    return TestReturn;
}